

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

bool write_to_descriptor(int desc,char *txt,int length)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  string_view fmt;
  char *local_38;
  
  if (length < 1) {
    sVar2 = strlen(txt);
    length = (int)sVar2;
  }
  bVar5 = length < 1;
  if (0 < length) {
    sVar2 = 0x1000;
    if (length < 0x1000) {
      sVar2 = (size_t)(uint)length;
    }
    sVar3 = write(desc,txt,sVar2);
    if (-1 < (int)sVar3) {
      uVar6 = 0;
      do {
        uVar6 = (int)sVar3 + uVar6;
        iVar1 = length - uVar6;
        bVar5 = iVar1 == 0 || length < (int)uVar6;
        if (iVar1 == 0 || length < (int)uVar6) {
          return bVar5;
        }
        if (0xfff < iVar1) {
          iVar1 = 0x1000;
        }
        sVar3 = write(desc,txt + uVar6,(long)iVar1);
      } while (-1 < (int)sVar3);
    }
    piVar4 = __errno_location();
    local_38 = strerror(*piVar4);
    fmt._M_str = "Write_to_descriptor: write: {}";
    fmt._M_len = 0x1e;
    CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt,&local_38);
  }
  return bVar5;
}

Assistant:

bool write_to_descriptor(int desc, char *txt, int length)
{
	int iStart;
	int nWrite;
	int nBlock;

	if (length <= 0)
		length = strlen(txt);

	for (iStart = 0; iStart < length; iStart += nWrite)
	{
		nBlock = std::min(length - iStart, 4096);
		if ((nWrite = write(desc, txt + iStart, nBlock)) < 0)
		{
			RS.Logger.Warn("Write_to_descriptor: write: {}", std::strerror(errno));
			return false;
		}
	}

	return true;
}